

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

TypedExpectation<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *
__thiscall
testing::internal::
FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::
FindMatchingExpectationLocked
          (FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
           *this,ArgumentTuple *args)

{
  TypedExpectation<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *this_00;
  bool bVar1;
  __normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
  __tmp;
  pointer psVar2;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  psVar2 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar2 == (this->super_UntypedFunctionMockerBase).untyped_expectations_.
                  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      return (TypedExpectation<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
              *)0x0;
    }
    this_00 = (TypedExpectation<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
               *)psVar2[-1].
                 super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
    psVar2 = psVar2 + -1;
    bVar1 = TypedExpectation<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
            ::ShouldHandleArguments(this_00,args);
  } while (!bVar1);
  return this_00;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    // See the definition of untyped_expectations_ for why access to
    // it is unprotected here.
    for (typename UntypedExpectations::const_reverse_iterator it =
             untyped_expectations_.rbegin();
         it != untyped_expectations_.rend(); ++it) {
      TypedExpectation<F>* const exp =
          static_cast<TypedExpectation<F>*>(it->get());
      if (exp->ShouldHandleArguments(args)) {
        return exp;
      }
    }
    return nullptr;
  }